

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_operator_subscript_Test::TestBody
          (test_matrix_sparse_operator_subscript_Test *this)

{
  initializer_list<double> value;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  AssertHelper AVar3;
  AssertHelper AVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  Scalar *pSVar9;
  char *pcVar10;
  StringLike<const_char_*> *regex;
  _func_int **pp_Var11;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar_2;
  Matrix_Sparse matrix_1;
  Matrix_Sparse matrix_0;
  AssertHelper local_138;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_130;
  undefined1 local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  pointer local_100;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f0;
  pointer local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  size_t local_b0;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *local_a8;
  undefined8 uStack_a0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  Matrix_Sparse local_80;
  
  local_f8 = (undefined1  [8])0x0;
  pbStack_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_e8 = (pointer)0x2;
  _local_120 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(ZEXT816(1) << 0x40);
  local_a8 = &local_130;
  local_130.matrix = (Matrix_Sparse *)0x3ff0000000000000;
  local_130.row_index = 0x4000000000000000;
  uStack_a0 = 2;
  value._M_len = 2;
  value._M_array = (iterator)local_a8;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)local_f8;
  index._M_len = 2;
  index._M_array = (iterator)local_120;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_80,non_zero,index,value,2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_130.row_index;
  local_130 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(auVar1 << 0x40);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_120,(size_t *)&local_80);
  local_138.data_ = (AssertHelperData *)0x0;
  pSVar9 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_120,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f8,"matrix_0[0][0]","1.0",*pSVar9,1.0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_120);
    if (pbStack_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x62,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_120 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(unsigned_long *)local_120 + 8))();
    }
  }
  if (pbStack_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f0,pbStack_f0);
  }
  local_130.matrix = (Matrix_Sparse *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_120,(size_t *)&local_80);
  local_138.data_ = (AssertHelperData *)0x1;
  pSVar9 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_120,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f8,"matrix_0[1][1]","2.0",*pSVar9,2.0);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_120);
    if (pbStack_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pbStack_f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,99,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_120 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(unsigned_long *)local_120 + 8))();
    }
  }
  if (pbStack_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_f0,pbStack_f0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_118._M_pi;
  _local_120 = (Matrix_Sparse_Row<const_Disa::Matrix_Sparse>)(auVar2 << 0x40);
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_80);
  local_130.matrix = (Matrix_Sparse *)0x1;
  pSVar9 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_f8,(size_t *)&local_130);
  *pSVar9 = (Scalar)&DAT_4008000000000000;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,
             &local_80.row_non_zero);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e0,&local_80.column_index);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,&local_80.element_value);
  local_b0 = local_80.column_size;
  local_138.data_ = (AssertHelperData *)0x0;
  local_130 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_138);
  local_100 = (pointer)0x0;
  pSVar9 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_130,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[0][0]","1.0",*pSVar9,1.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16f7f4;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x67,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if (local_130.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_130.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  local_138.data_ = (AssertHelperData *)0x0;
  local_130 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_138);
  local_100 = (pointer)0x1;
  pSVar9 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_130,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[0][1]","3.0",*pSVar9,3.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16f7f4;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x68,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if (local_130.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_130.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  local_138.data_ = (AssertHelperData *)0x1;
  local_130 = Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_f8,(size_t *)&local_138);
  local_100 = (pointer)0x1;
  pSVar9 = Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                     (&local_130,(size_t *)&local_100);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_120,"matrix_1[1][1]","2.0",*pSVar9,2.0);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_118._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var11 = (_func_int **)0x16f7f4;
    }
    else {
      pp_Var11 = (local_118._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x69,(char *)pp_Var11);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    if (local_130.matrix != (Matrix_Sparse *)0x0) {
      (*(code *)((local_130.matrix)->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1])();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_120 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._M_pi);
  }
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    local_130.matrix = (Matrix_Sparse *)"./*";
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_120,
               (testing *)&local_130,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_98,(PolymorphicMatcher *)local_120);
    if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
    }
    bVar6 = testing::internal::DeathTest::Create
                      ("matrix_1[1][0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x6c,(DeathTest **)&local_138);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    AVar3.data_ = local_138.data_;
    bVar5 = true;
    if (bVar6) {
      if (local_138.data_ != (AssertHelperData *)0x0) {
        iVar8 = (**(code **)(*(long *)local_138.data_ + 0x10))(local_138.data_);
        AVar4.data_ = local_138.data_;
        if (iVar8 == 0) {
          iVar8 = (**(code **)(*(long *)local_138.data_ + 0x18))(local_138.data_);
          bVar5 = testing::internal::ExitedUnsuccessfully(iVar8);
          cVar7 = (**(code **)(*(long *)AVar4.data_ + 0x20))(AVar4.data_,bVar5);
          if (cVar7 != '\0') goto LAB_00112b51;
          bVar5 = true;
          bVar6 = false;
        }
        else {
          if (iVar8 == 1) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              local_130.matrix = (Matrix_Sparse *)0x1;
              _local_120 = Disa::Matrix_Sparse::operator[]
                                     ((Matrix_Sparse *)local_f8,(size_t *)&local_130);
              local_100 = (pointer)0x0;
              Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[]
                        ((Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_120,
                         (size_t *)&local_100);
            }
            (**(code **)(*(long *)local_138.data_ + 0x28))(local_138.data_,2);
            (**(code **)(*(long *)AVar4.data_ + 0x28))(AVar4.data_,0);
          }
LAB_00112b51:
          bVar5 = false;
          bVar6 = true;
        }
        (**(code **)(*(long *)AVar3.data_ + 8))(AVar3.data_);
        if (!bVar6) goto LAB_00112b64;
      }
      bVar5 = false;
    }
LAB_00112b64:
    if (!bVar5) goto LAB_00112bbe;
  }
  testing::Message::Message((Message *)local_120);
  pcVar10 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x6c,pcVar10);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_120);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_120 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_120 + 8))();
  }
LAB_00112bbe:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_f8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_subscript) {
  Matrix_Sparse matrix_0({0, 1, 2}, {0, 1}, {1.0, 2.0}, 2);

  EXPECT_DOUBLE_EQ(matrix_0[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][1], 2.0);
  matrix_0[0][1] = 3.0;  // this should insert a new element.

  const Matrix_Sparse matrix_1 = matrix_0;
  EXPECT_DOUBLE_EQ(matrix_1[0][0], 1.0);
  EXPECT_DOUBLE_EQ(matrix_1[0][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix_1[1][1], 2.0);

  // Check debug for const matrix.
  EXPECT_DEATH(matrix_1[1][0], "./*");
}